

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult *
iutest::internal::CmpHelperNearFloatingPoint<double>
          (char *expr1,char *expr2,char *absc,double val1,double val2,double abs_v)

{
  bool bVar1;
  AssertionResult *pAVar2;
  AssertionResult *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double diff;
  floating_point<double> f2;
  floating_point<double> f1;
  FInt local_a0;
  double local_98;
  double local_90;
  double local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  string local_68;
  _Myt local_48;
  FInt local_40;
  AssertionResult local_38;
  
  local_a0.uv = ~-(ulong)(in_XMM1_Qa < in_XMM0_Qa) & (ulong)(in_XMM1_Qa - in_XMM0_Qa) |
                (ulong)(in_XMM0_Qa - in_XMM1_Qa) & -(ulong)(in_XMM1_Qa < in_XMM0_Qa);
  if ((in_XMM2_Qa <= local_a0.fv) &&
     (local_40.uv = local_a0.uv,
     bVar1 = floating_point<double>::AlmostEquals((floating_point<double> *)&local_40,&local_48),
     !bVar1)) {
    local_38.m_message._M_dataplus._M_p = (pointer)&local_38.m_message.field_2;
    local_38.m_message._M_string_length = 0;
    local_38.m_message.field_2._M_local_buf[0] = '\0';
    local_38.m_result = false;
    pAVar2 = AssertionResult::operator<<(&local_38,(char (*) [22])"error: Value of: abs(");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_70);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])" - ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_78);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [6])") <= ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_80);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [16])"\n  Actual: abs(");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_88);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])" - ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_90);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])") : ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_a0.fv);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"\nExpected: ");
    PrintToString<double>(&local_68,&local_98);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_68);
    AssertionResult::AssertionResult(in_RDI,pAVar2);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_38);
    return in_RDI;
  }
  (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
  (in_RDI->m_message)._M_string_length = 0;
  (in_RDI->m_message).field_2._M_local_buf[0] = '\0';
  in_RDI->m_result = true;
  return in_RDI;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNearFloatingPoint(
    const char* expr1, const char* expr2, const char* absc
        , RawType val1, RawType val2, RawType abs_v)
{
    const RawType diff = val1 > val2 ? val1 - val2 : val2 - val1;
    if IUTEST_COND_LIKELY( diff < abs_v )
    {
        return AssertionSuccess();
    }